

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O1

void StartTorControl(CService onion_service_target)

{
  undefined2 uVar1;
  char *pcVar2;
  thread tVar3;
  id __tmp;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  id local_58;
  long *local_50;
  direct_or_indirect local_48;
  uint local_38;
  char *local_30;
  undefined2 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (gBase != (event_base *)0x0) {
    __assert_fail("!gBase",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
                  ,0x2a6,"void StartTorControl(CService)");
  }
  evthread_use_pthreads();
  gBase = (event_base *)event_base_new();
  if (gBase == (event_base *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003d6782;
    logging_function._M_str = "StartTorControl";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<>(logging_function,source_file,0x2ae,ALL,Info,"tor: Unable to create event_base\n");
  }
  else {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_48.indirect_contents,
               in_RDI);
    pcVar2 = in_RDI[1]._union.indirect_contents.indirect;
    uVar1 = *(undefined2 *)((long)&in_RDI[1]._union + 8);
    local_58._M_thread = 0;
    local_30 = pcVar2;
    local_28 = uVar1;
    local_50 = (long *)operator_new(0x40);
    *local_50 = (long)&PTR___State_impl_00b3a2d0;
    *(undefined4 *)(local_50 + 1) = local_48._0_4_;
    *(undefined4 *)((long)local_50 + 0xc) = local_48._4_4_;
    *(size_type *)(local_50 + 2) = local_48.indirect_contents.capacity;
    *(undefined4 *)((long)local_50 + 0x14) = local_48._12_4_;
    *(uint *)(local_50 + 3) = local_38;
    local_38 = 0;
    local_50[4] = (long)pcVar2;
    *(undefined2 *)(local_50 + 5) = uVar1;
    local_50[6] = (long)"torcontrol";
    local_50[7] = (long)util::TraceThread;
    std::thread::_M_start_thread(&local_58,&local_50,0);
    if (local_50 != (long *)0x0) {
      (**(code **)(*local_50 + 8))();
    }
    tVar3._M_id._M_thread = torControlThread._M_id._M_thread;
    if (torControlThread._M_id._M_thread != 0) {
      std::terminate();
    }
    torControlThread._M_id._M_thread = (id)(id)local_58._M_thread;
    local_58 = tVar3._M_id._M_thread;
    if (0x10 < local_38) {
      free(local_48.indirect_contents.indirect);
      local_48.indirect_contents.indirect = (char *)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_003d6782:
      __stack_chk_fail();
    }
  }
  return;
}

Assistant:

void StartTorControl(CService onion_service_target)
{
    assert(!gBase);
#ifdef WIN32
    evthread_use_windows_threads();
#else
    evthread_use_pthreads();
#endif
    gBase = event_base_new();
    if (!gBase) {
        LogPrintf("tor: Unable to create event_base\n");
        return;
    }

    torControlThread = std::thread(&util::TraceThread, "torcontrol", [onion_service_target] {
        TorControlThread(onion_service_target);
    });
}